

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void dequantize_row_q5_0(block_q5_0 *x,float *y,int64_t k)

{
  byte bVar1;
  uint uVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar3;
  int32_t x1;
  int32_t x0;
  uint8_t xh_1;
  uint8_t xh_0;
  int j;
  uint32_t qh;
  float d;
  int i;
  int nb;
  undefined4 local_2c;
  undefined4 local_20;
  
  for (local_20 = 0; local_20 < (int)(in_RDX / 0x20); local_20 = local_20 + 1) {
    fVar3 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RDI + (long)local_20 * 0x16));
    uVar2 = *(uint *)(in_RDI + (long)local_20 * 0x16 + 2);
    for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
      bVar1 = *(byte *)(in_RDI + (long)local_20 * 0x16 + 6 + (long)local_2c);
      *(float *)(in_RSI + (long)(local_20 * 0x20 + local_2c) * 4) =
           (float)(int)((*(byte *)(in_RDI + (long)local_20 * 0x16 + 6 + (long)local_2c) & 0xf |
                        (uint)((byte)((uVar2 >> ((byte)local_2c & 0x1f)) << 4) & 0x10)) - 0x10) *
           fVar3;
      *(float *)(in_RSI + (long)(local_20 * 0x20 + local_2c + 0x10) * 4) =
           (float)(int)(((int)(uint)bVar1 >> 4 |
                        (uint)((byte)(uVar2 >> ((byte)local_2c + 0xc & 0x1f)) & 0x10)) - 0x10) *
           fVar3;
    }
  }
  return;
}

Assistant:

void dequantize_row_q5_0(const block_q5_0 * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    static const int qk = QK5_0;

    assert(k % qk == 0);

    const int nb = k / qk;

    for (int i = 0; i < nb; i++) {
        const float d = GGML_FP16_TO_FP32(x[i].d);

        uint32_t qh;
        memcpy(&qh, x[i].qh, sizeof(qh));

        for (int j = 0; j < qk/2; ++j) {
            const uint8_t xh_0 = ((qh >> (j +  0)) << 4) & 0x10;
            const uint8_t xh_1 = ((qh >> (j + 12))     ) & 0x10;

            const int32_t x0 = ((x[i].qs[j] & 0x0F) | xh_0) - 16;
            const int32_t x1 = ((x[i].qs[j] >>   4) | xh_1) - 16;

            y[i*qk + j + 0   ] = x0*d;
            y[i*qk + j + qk/2] = x1*d;
        }
    }
}